

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IrisUtils.cpp
# Opt level: O2

void IRIS::SaveSplit(string *path,Dataset *dataset)

{
  ostream *poVar1;
  pointer pvVar2;
  int sampleId;
  ulong uVar3;
  int paramId;
  ulong uVar4;
  ofstream file;
  
  std::ofstream::ofstream(&file,(string *)path,_S_out);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&file);
  std::operator<<(poVar1,"\n");
  uVar3 = 0;
  while( true ) {
    pvVar2 = (dataset->xTrain).
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(dataset->xTrain).
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18) <= uVar3)
    break;
    for (uVar4 = 0;
        uVar4 < (ulong)((long)*(pointer *)
                               ((long)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>).
                                       _M_impl + 8) -
                        *(long *)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>).
                                  _M_impl >> 2); uVar4 = uVar4 + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&file,
                          *(float *)(*(long *)&pvVar2[uVar3].
                                               super__Vector_base<float,_std::allocator<float>_> +
                                    uVar4 * 4));
      std::operator<<(poVar1," ");
      pvVar2 = (dataset->xTrain).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&file,
                        (dataset->yTrain).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3]);
    std::operator<<(poVar1,"\n");
    uVar3 = uVar3 + 1;
  }
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&file);
  std::operator<<(poVar1,"\n");
  uVar3 = 0;
  while( true ) {
    pvVar2 = (dataset->xTest).
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(dataset->xTest).
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18) <= uVar3)
    break;
    for (uVar4 = 0;
        uVar4 < (ulong)((long)*(pointer *)
                               ((long)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>).
                                       _M_impl.super__Vector_impl_data + 8) -
                        *(long *)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>).
                                  _M_impl.super__Vector_impl_data >> 2); uVar4 = uVar4 + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&file,
                          *(float *)(*(long *)&pvVar2[uVar3].
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl + uVar4 * 4));
      std::operator<<(poVar1," ");
      pvVar2 = (dataset->xTest).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&file,
                        (dataset->yTest).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3]);
    std::operator<<(poVar1,"\n");
    uVar3 = uVar3 + 1;
  }
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void IRIS::SaveSplit( const std::string &path, SPIKING_NN::Dataset &dataset )
{
    std::ofstream file( path );
    file << dataset.xTrain.size() << "\n";
    for ( int sampleId = 0; sampleId < dataset.xTrain.size(); ++sampleId ) {
        for ( int paramId = 0; paramId < dataset.xTrain[0].size(); ++paramId ) {
            file << dataset.xTrain[sampleId][paramId] << " ";
        }
        file << dataset.yTrain[sampleId] << "\n";
    }
    file << dataset.xTest.size() << "\n";
    for ( int sampleId = 0; sampleId < dataset.xTest.size(); ++sampleId ) {
        for ( int paramId = 0; paramId < dataset.xTest[0].size(); ++paramId ) {
            file << dataset.xTest[sampleId][paramId] << " ";
        }
        file << dataset.yTest[sampleId] << "\n";
    }
}